

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall wasm::TypeBuilder::setHeapType(TypeBuilder *this,size_t i,Struct *struct_)

{
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Var1;
  long lVar2;
  HeapTypeInfo local_68;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  lVar2 = *(long *)&((_Var1._M_head_impl)->entries).
                    super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
  ;
  if (i < (ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->entries + 8) - lVar2 >> 4)) {
    anon_unknown_0::HeapTypeInfo::HeapTypeInfo(&local_68,struct_);
    Impl::Entry::set((Entry *)(lVar2 + i * 0x10),&local_68);
    anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(&local_68);
    return;
  }
  __assert_fail("i < size() && \"index out of bounds\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x904,"void wasm::TypeBuilder::setHeapType(size_t, const Struct &)");
}

Assistant:

void TypeBuilder::setHeapType(size_t i, const Struct& struct_) {
  assert(i < size() && "index out of bounds");
  impl->entries[i].set(struct_);
}